

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O1

tommy_uint32_t tommy_hash_u32(tommy_uint32_t init_val,void *void_key,tommy_size_t key_len)

{
  uint uVar1;
  int iVar2;
  tommy_uint32_t tVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = init_val + (int)key_len + 0xdeadbeef;
  uVar6 = uVar1;
  uVar4 = uVar1;
  if (0xc < key_len) {
    do {
      uVar1 = uVar1 + *(int *)((long)void_key + 8);
      uVar4 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *void_key) - uVar1;
      iVar2 = uVar1 + uVar6 + *(int *)((long)void_key + 4);
      uVar6 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar6 + *(int *)((long)void_key + 4)) - uVar4;
      iVar5 = uVar4 + iVar2;
      uVar1 = (uVar6 << 8 | uVar6 >> 0x18) ^ iVar2 - uVar6;
      iVar2 = uVar6 + iVar5;
      uVar4 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar5 - uVar1;
      iVar5 = uVar1 + iVar2;
      uVar6 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar2 - uVar4;
      uVar4 = uVar4 + iVar5;
      uVar1 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar5 - uVar6;
      uVar6 = uVar6 + uVar4;
      key_len = key_len - 0xc;
      void_key = (void *)((long)void_key + 0xc);
    } while (0xc < key_len);
  }
  tVar3 = (*(code *)(&DAT_00117b64 + *(int *)(&DAT_00117b64 + key_len * 4)))
                    (uVar4,void_key,&DAT_00117b64 + *(int *)(&DAT_00117b64 + key_len * 4),uVar6);
  return tVar3;
}

Assistant:

tommy_uint32_t tommy_hash_u32(tommy_uint32_t init_val, const void* void_key, tommy_size_t key_len)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;

	a = b = c = 0xdeadbeef + ((tommy_uint32_t)key_len) + init_val;

	while (key_len > 12) {
		a += tommy_le_uint32_read(key + 0);
		b += tommy_le_uint32_read(key + 4);
		c += tommy_le_uint32_read(key + 8);

		tommy_mix(a, b, c);

		key_len -= 12;
		key += 12;
	}

	switch (key_len) {
	case 0 :
		return c; /* used only when called with a zero length */
	case 12 :
		c += tommy_le_uint32_read(key + 8);
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 11 : c += ((tommy_uint32_t)key[10]) << 16; /* fallthrough */
	case 10 : c += ((tommy_uint32_t)key[9]) << 8; /* fallthrough */
	case 9 : c += key[8]; /* fallthrough */
	case 8 :
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 7 : b += ((tommy_uint32_t)key[6]) << 16; /* fallthrough */
	case 6 : b += ((tommy_uint32_t)key[5]) << 8; /* fallthrough */
	case 5 : b += key[4]; /* fallthrough */
	case 4 :
		a += tommy_le_uint32_read(key + 0);
		break;
	case 3 : a += ((tommy_uint32_t)key[2]) << 16; /* fallthrough */
	case 2 : a += ((tommy_uint32_t)key[1]) << 8; /* fallthrough */
	case 1 : a += key[0]; /* fallthrough */
	}

	tommy_final(a, b, c);

	return c;
}